

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_command * nk__begin(nk_context *ctx)

{
  long lVar1;
  long in_RDI;
  bool bVar2;
  nk_byte *buffer;
  nk_window *iter;
  nk_context *in_stack_00000030;
  long local_18;
  nk_command *local_8;
  
  if (in_RDI == 0) {
    local_8 = (nk_command *)0x0;
  }
  else if (*(int *)(in_RDI + 0x3fd8) == 0) {
    local_8 = (nk_command *)0x0;
  }
  else {
    lVar1 = *(long *)(in_RDI + 0x1f00);
    if (*(int *)(in_RDI + 0x3f60) == 0) {
      nk_build(in_stack_00000030);
      *(undefined4 *)(in_RDI + 0x3f60) = 1;
    }
    local_18 = *(long *)(in_RDI + 0x3fb0);
    while( true ) {
      bVar2 = false;
      if ((local_18 != 0) &&
         (bVar2 = true, *(long *)(local_18 + 0x88) != *(long *)(local_18 + 0x90))) {
        bVar2 = (*(uint *)(local_18 + 0x48) & 0x1000) != 0;
      }
      if (!bVar2) break;
      local_18 = *(long *)(local_18 + 0x188);
    }
    if (local_18 == 0) {
      local_8 = (nk_command *)0x0;
    }
    else {
      local_8 = (nk_command *)(lVar1 + *(long *)(local_18 + 0x88));
    }
  }
  return local_8;
}

Assistant:

NK_API const struct nk_command*
nk__begin(struct nk_context *ctx)
{
    struct nk_window *iter;
    nk_byte *buffer;
    NK_ASSERT(ctx);
    if (!ctx) return 0;
    if (!ctx->count) return 0;

    buffer = (nk_byte*)ctx->memory.memory.ptr;
    if (!ctx->build) {
        nk_build(ctx);
        ctx->build = nk_true;
    }

    iter = ctx->begin;
    while (iter && ((iter->buffer.begin == iter->buffer.end) || (iter->flags & NK_WINDOW_HIDDEN)))
        iter = iter->next;
    if (!iter) return 0;
    return nk_ptr_add_const(struct nk_command, buffer, iter->buffer.begin);
}